

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int color_count_comp(void *c1,void *c2)

{
  ColorCount *color_count2;
  ColorCount *color_count1;
  void *c2_local;
  void *c1_local;
  undefined4 local_4;
  
  if (*(int *)((long)c2 + 4) < *(int *)((long)c1 + 4)) {
    local_4 = -1;
  }
  else if (*(int *)((long)c1 + 4) < *(int *)((long)c2 + 4)) {
    local_4 = 1;
  }
  else if (*c1 < *c2) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int color_count_comp(const void *c1, const void *c2) {
  const struct ColorCount *color_count1 = (const struct ColorCount *)c1;
  const struct ColorCount *color_count2 = (const struct ColorCount *)c2;
  if (color_count1->count > color_count2->count) return -1;
  if (color_count1->count < color_count2->count) return 1;
  if (color_count1->index < color_count2->index) return -1;
  return 1;
}